

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bus.c
# Opt level: O0

void bus0_sock_recv(void *arg,nni_aio *aio)

{
  bus0_sock *aio_00;
  _Bool _Var1;
  size_t count;
  nni_msg *local_28;
  nni_msg *msg;
  bus0_sock *s;
  nni_aio *aio_local;
  void *arg_local;
  
  msg = (nni_msg *)arg;
  s = (bus0_sock *)aio;
  aio_local = (nni_aio *)arg;
  nni_mtx_lock((nni_mtx *)((long)arg + 0x18));
  while( true ) {
    _Var1 = nni_lmq_empty((nni_lmq *)&(msg->m_body).ch_ptr);
    if (_Var1) {
      _Var1 = nni_aio_start((nni_aio *)s,bus0_recv_cancel,msg);
      if (_Var1) {
        nni_list_append((nni_list *)((long)&msg->m_addr + 0x38),s);
        nni_mtx_unlock((nni_mtx *)(msg->m_header_buf + 6));
      }
      else {
        nni_mtx_unlock((nni_mtx *)(msg->m_header_buf + 6));
      }
      return;
    }
    nni_lmq_get((nni_lmq *)&(msg->m_body).ch_ptr,&local_28);
    _Var1 = nni_lmq_empty((nni_lmq *)&(msg->m_body).ch_ptr);
    if (_Var1) {
      nni_pollable_clear((nni_pollable *)&(msg->m_body).ch_len);
    }
    local_28 = nni_msg_unique(local_28);
    if (local_28 != (nni_msg *)0x0) break;
    local_28 = (nni_msg *)0x0;
  }
  nni_aio_set_msg((nni_aio *)s,local_28);
  nni_mtx_unlock((nni_mtx *)(msg->m_header_buf + 6));
  aio_00 = s;
  count = nni_msg_len(local_28);
  nni_aio_finish((nni_aio *)aio_00,NNG_OK,count);
  return;
}

Assistant:

static void
bus0_sock_recv(void *arg, nni_aio *aio)
{
	bus0_sock *s = arg;
	nni_msg   *msg;

	nni_mtx_lock(&s->mtx);
again:
	if (nni_lmq_empty(&s->recv_msgs)) {
		if (!nni_aio_start(aio, bus0_recv_cancel, s)) {
			nni_mtx_unlock(&s->mtx);
			return;
		}
		nni_list_append(&s->recv_wait, aio);
		nni_mtx_unlock(&s->mtx);
		return;
	}

	(void) nni_lmq_get(&s->recv_msgs, &msg);

	if (nni_lmq_empty(&s->recv_msgs)) {
		nni_pollable_clear(&s->can_recv);
	}
	if ((msg = nni_msg_unique(msg)) == NULL) {
		goto again;
	}
	nni_aio_set_msg(aio, msg);
	nni_mtx_unlock(&s->mtx);
	nni_aio_finish(aio, 0, nni_msg_len(msg));
}